

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

vector<Tetris,_std::allocator<Tetris>_> * __thiscall
GameBoard::getPlaces
          (GameBoard *this,int id,int blockType,vector<Tetris,_std::allocator<Tetris>_> *ans,
          bool unique)

{
  iterator __position;
  vector<Tetris,std::allocator<Tetris>> *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int o;
  long lVar7;
  int iVar8;
  int y;
  ulong uVar9;
  ulong uVar10;
  queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_> q;
  Tetris local_c8;
  int local_9c;
  undefined1 local_98 [24];
  _Elt_pointer pTStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  vector<Tetris,std::allocator<Tetris>> *local_48;
  int (*local_40) [4];
  int (*local_38) [4];
  
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  stack0xffffffffffffff78 = (undefined1  [16])0x0;
  local_98._0_16_ = (undefined1  [16])0x0;
  std::_Deque_base<Tetris,_std::allocator<Tetris>_>::_M_initialize_map
            ((_Deque_base<Tetris,_std::allocator<Tetris>_> *)local_98,0);
  memset(getPlaces::vis,0,0x420);
  local_c8.shape = blockShape[blockType];
  iVar8 = 0x14;
  do {
    lVar7 = 6;
    bVar1 = false;
    do {
      if (this->gridInfo[(long)id + -1][(long)iVar8 + 0x15][lVar7 + 7] != 0) {
        bVar1 = true;
      }
    } while ((lVar7 - 5U < 10) && (lVar7 = lVar7 + 1, !bVar1));
    iVar8 = iVar8 - (uint)(bVar1 ^ 1U);
  } while ((bVar1 ^ 1U) != 0);
  lVar7 = 0;
  local_38 = blockHalfHeight + blockType;
  local_40 = blockHeight + blockType;
  local_c8.gameBoard = this;
  local_c8.blockType = blockType;
  local_c8.color = id;
  local_9c = blockType;
  local_48 = (vector<Tetris,std::allocator<Tetris>> *)ans;
  do {
    iVar2 = ((*local_38)[lVar7] - (*local_40)[lVar7]) + 0x15;
    iVar6 = (*local_40)[lVar7] + iVar8 + 1;
    if (iVar2 <= iVar6) {
      iVar6 = iVar2;
    }
    iVar2 = 1;
    do {
      iVar3 = iVar6;
      if (iVar6 == -1) {
        iVar3 = local_c8.blockX;
      }
      local_c8.orientation = (int)lVar7;
      local_c8.blockX = iVar3;
      local_c8.blockY = iVar2;
      bVar1 = Tetris::isValid(&local_c8,-1,-1,-1);
      if (bVar1) {
        if ((_Elt_pointer)local_68._0_8_ == (_Elt_pointer)(local_58._0_8_ + -0x28)) {
          std::deque<Tetris,std::allocator<Tetris>>::_M_push_back_aux<Tetris_const&>
                    ((deque<Tetris,std::allocator<Tetris>> *)local_98,&local_c8);
        }
        else {
          *(ulong *)(local_68._0_8_ + 0x20) = CONCAT44(local_c8._36_4_,local_c8.color);
          *(ulong *)(local_68._0_8_ + 0x10) = CONCAT44(local_c8.orientation,local_c8.blockY);
          *(int (**) [8])(local_68._0_8_ + 0x18) = local_c8.shape;
          *(GameBoard **)local_68._0_8_ = local_c8.gameBoard;
          *(ulong *)(local_68._0_8_ + 8) = CONCAT44(local_c8.blockX,local_c8.blockType);
          local_68._0_8_ = (_Elt_pointer)(local_68._0_8_ + 0x28);
        }
        getPlaces::vis[local_c8.blockX][local_c8.blockY][local_c8.orientation] = true;
      }
      this_00 = local_48;
      iVar3 = local_9c;
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0xb);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  do {
    do {
      uVar10 = *(ulong *)(local_98._16_8_ + 0xc);
      uVar9 = CONCAT44(-(uint)((int)(uVar10 >> 0x20) == -1),-(uint)((int)uVar10 == -1));
      uVar10 = ~uVar9 & uVar10 | CONCAT44(local_c8.blockY,local_c8.blockX) & uVar9;
      local_c8.blockX = (int)uVar10;
      local_c8.blockY = (int)(uVar10 >> 0x20);
      iVar8 = *(int *)(local_98._16_8_ + 0x14);
      if (*(int *)(local_98._16_8_ + 0x14) == -1) {
        iVar8 = local_c8.orientation;
      }
      local_c8.orientation = iVar8;
      if ((_Elt_pointer)local_98._16_8_ == (_Elt_pointer)(local_78._0_8_ + -0x28)) {
        operator_delete(pTStack_80);
        local_98._16_8_ = *(_Map_pointer)(local_78._8_8_ + 8);
        local_78._8_8_ = (_Map_pointer)(local_78._8_8_ + 8);
        local_78._0_8_ = (_Elt_pointer)(local_98._16_8_ + 0x1e0);
        pTStack_80 = (_Elt_pointer)local_98._16_8_;
      }
      else {
        local_98._16_8_ = local_98._16_8_ + 0x28;
      }
      bVar1 = Tetris::onGround(&local_c8);
      if (bVar1) {
        __position._M_current = *(Tetris **)(this_00 + 8);
        if (__position._M_current == *(Tetris **)(this_00 + 0x10)) {
          std::vector<Tetris,std::allocator<Tetris>>::_M_realloc_insert<Tetris_const&>
                    (this_00,__position,&local_c8);
        }
        else {
          *(ulong *)&(__position._M_current)->color = CONCAT44(local_c8._36_4_,local_c8.color);
          (__position._M_current)->blockY = local_c8.blockY;
          (__position._M_current)->orientation = local_c8.orientation;
          (__position._M_current)->shape = local_c8.shape;
          (__position._M_current)->gameBoard = local_c8.gameBoard;
          (__position._M_current)->blockType = local_c8.blockType;
          (__position._M_current)->blockX = local_c8.blockX;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x28;
        }
      }
      lVar7 = (long)local_c8.blockY;
      local_c8.blockY = local_c8.blockY + 1;
      if (*(char *)((long)local_c8.orientation + (long)local_c8.blockX * 0x30 + lVar7 * 4 + 0x122cf4
                   ) == '\0') {
        bVar1 = Tetris::isValid(&local_c8,-1,-1,-1);
        if (bVar1) {
          if ((_Elt_pointer)local_68._0_8_ == (_Elt_pointer)(local_58._0_8_ + -0x28)) {
            std::deque<Tetris,std::allocator<Tetris>>::_M_push_back_aux<Tetris_const&>
                      ((deque<Tetris,std::allocator<Tetris>> *)local_98,&local_c8);
          }
          else {
            *(ulong *)(local_68._0_8_ + 0x20) = CONCAT44(local_c8._36_4_,local_c8.color);
            *(ulong *)(local_68._0_8_ + 0x10) = CONCAT44(local_c8.orientation,local_c8.blockY);
            *(int (**) [8])(local_68._0_8_ + 0x18) = local_c8.shape;
            *(GameBoard **)local_68._0_8_ = local_c8.gameBoard;
            *(ulong *)(local_68._0_8_ + 8) = CONCAT44(local_c8.blockX,local_c8.blockType);
            local_68._0_8_ = (_Elt_pointer)(local_68._0_8_ + 0x28);
          }
          getPlaces::vis[local_c8.blockX][local_c8.blockY][local_c8.orientation] = true;
        }
      }
      lVar7 = (long)local_c8.blockY;
      local_c8.blockY = local_c8.blockY + -2;
      if (*(char *)((long)local_c8.orientation + (long)local_c8.blockX * 0x30 + lVar7 * 4 + 0x122ce8
                   ) == '\0') {
        bVar1 = Tetris::isValid(&local_c8,-1,-1,-1);
        if (bVar1) {
          if ((_Elt_pointer)local_68._0_8_ == (_Elt_pointer)(local_58._0_8_ + -0x28)) {
            std::deque<Tetris,std::allocator<Tetris>>::_M_push_back_aux<Tetris_const&>
                      ((deque<Tetris,std::allocator<Tetris>> *)local_98,&local_c8);
          }
          else {
            *(ulong *)(local_68._0_8_ + 0x20) = CONCAT44(local_c8._36_4_,local_c8.color);
            *(ulong *)(local_68._0_8_ + 0x10) = CONCAT44(local_c8.orientation,local_c8.blockY);
            *(int (**) [8])(local_68._0_8_ + 0x18) = local_c8.shape;
            *(GameBoard **)local_68._0_8_ = local_c8.gameBoard;
            *(ulong *)(local_68._0_8_ + 8) = CONCAT44(local_c8.blockX,local_c8.blockType);
            local_68._0_8_ = (_Elt_pointer)(local_68._0_8_ + 0x28);
          }
          getPlaces::vis[local_c8.blockX][local_c8.blockY][local_c8.orientation] = true;
        }
      }
      lVar7 = (long)local_c8.blockY;
      local_c8.blockY = local_c8.blockY + 1;
      lVar4 = (long)local_c8.blockX;
      local_c8.blockX = (int)(lVar4 + -1);
      if (*(char *)((long)local_c8.orientation + (lVar4 + -1) * 0x30 + lVar7 * 4 + 0x122cf4) == '\0'
         ) {
        bVar1 = Tetris::isValid(&local_c8,-1,-1,-1);
        if (bVar1) {
          if ((_Elt_pointer)local_68._0_8_ == (_Elt_pointer)(local_58._0_8_ + -0x28)) {
            std::deque<Tetris,std::allocator<Tetris>>::_M_push_back_aux<Tetris_const&>
                      ((deque<Tetris,std::allocator<Tetris>> *)local_98,&local_c8);
          }
          else {
            *(ulong *)(local_68._0_8_ + 0x20) = CONCAT44(local_c8._36_4_,local_c8.color);
            *(ulong *)(local_68._0_8_ + 0x10) = CONCAT44(local_c8.orientation,local_c8.blockY);
            *(int (**) [8])(local_68._0_8_ + 0x18) = local_c8.shape;
            *(GameBoard **)local_68._0_8_ = local_c8.gameBoard;
            *(ulong *)(local_68._0_8_ + 8) = CONCAT44(local_c8.blockX,local_c8.blockType);
            local_68._0_8_ = (_Elt_pointer)(local_68._0_8_ + 0x28);
          }
          getPlaces::vis[local_c8.blockX][local_c8.blockY][local_c8.orientation] = true;
        }
      }
      lVar7 = (long)local_c8.blockX;
      local_c8.blockX = (int)(lVar7 + 1);
    } while (iVar3 == 6);
    uVar5 = local_c8.orientation + 4;
    if (-1 < (int)(local_c8.orientation + 1U)) {
      uVar5 = local_c8.orientation + 1U;
    }
    iVar8 = (local_c8.orientation - (uVar5 & 0xfffffffc)) + 1;
    bVar1 = Tetris::rotation(&local_c8,iVar8);
    if ((bVar1) && (getPlaces::vis[lVar7 + 1][local_c8.blockY][iVar8] == false)) {
      local_c8.orientation = iVar8;
      if ((_Elt_pointer)local_68._0_8_ == (_Elt_pointer)(local_58._0_8_ + -0x28)) {
        std::deque<Tetris,std::allocator<Tetris>>::_M_push_back_aux<Tetris_const&>
                  ((deque<Tetris,std::allocator<Tetris>> *)local_98,&local_c8);
      }
      else {
        *(ulong *)(local_68._0_8_ + 0x20) = CONCAT44(local_c8._36_4_,local_c8.color);
        *(ulong *)(local_68._0_8_ + 0x10) = CONCAT44(iVar8,local_c8.blockY);
        *(int (**) [8])(local_68._0_8_ + 0x18) = local_c8.shape;
        *(GameBoard **)local_68._0_8_ = local_c8.gameBoard;
        *(ulong *)(local_68._0_8_ + 8) = CONCAT44(local_c8.blockX,local_c8.blockType);
        local_68._0_8_ = (_Elt_pointer)(local_68._0_8_ + 0x28);
      }
      getPlaces::vis[local_c8.blockX][local_c8.blockY][local_c8.orientation] = true;
    }
  } while( true );
}

Assistant:

vector<Tetris> &GameBoard::getPlaces(int id, int blockType, vector<Tetris> &ans, bool unique)
{
    queue<Tetris> q;
    static bool vis[MAPHEIGHT + 2][MAPWIDTH + 2][4];
    memset(vis, 0, sizeof(vis));
    Tetris tmp(this, blockType, id);
    int mh = MAPHEIGHT;
    while (1) {
        bool hv = false;
        for (int i = 1; i <= MAPWIDTH && !hv; ++i)
            if (gridInfo[id][mh][i] != 0)
                hv = true;
        if (hv)
            break;
        --mh;
    }
    for (int o = 0; o < 4; ++o) {
        int xo = MAPHEIGHT + blockHalfHeight[blockType][o] - blockHeight[blockType][o] + 1;
        xo = min(xo, mh + blockHeight[blockType][o] + 1);
        for (int y = 1; y <= MAPWIDTH; ++y)
            if (tmp.set(xo, y, o).isValid()) {
                q.push(tmp);
                vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
            }
    }
    //vector<Tetris> ans;
    while (!q.empty()) {
        auto &fr = q.front();
        tmp.set(fr.blockX, fr.blockY, fr.orientation);
        q.pop();
        if (tmp.onGround())
            ans.push_back(tmp);
        ++tmp.blockY;
        if (!vis[tmp.blockX][tmp.blockY][tmp.orientation] && tmp.isValid()) {
            q.push(tmp);
            vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
        }
        --tmp.blockY, --tmp.blockY;
        if (!vis[tmp.blockX][tmp.blockY][tmp.orientation] && tmp.isValid()) {
            q.push(tmp);
            vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
        }
        ++tmp.blockY, --tmp.blockX;
        if (!vis[tmp.blockX][tmp.blockY][tmp.orientation] && tmp.isValid()) {
            q.push(tmp);
            vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
        }
        ++tmp.blockX;
        if (blockType != 6) {
            int o2 = (tmp.orientation + 1) % 4;
            if (tmp.rotation(o2) && !vis[tmp.blockX][tmp.blockY][o2]) {
                tmp.orientation = o2;
                q.push(tmp);
                vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
            }
        }
    }
    /*if (!unique)
        return _ans = ans;
    _ans.clear();
    for (auto &i : ans) {
        bool hit = false;
        for (auto &t : _ans)
            if (i.same(t)) {
                hit = true;
                break;
            }
        if (!hit)
            _ans.push_back(i);
    }
    return _ans;*/
}